

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol_table.cpp
# Opt level: O1

void __thiscall front::symbolTable::SymbolTable::push_symbol(SymbolTable *this,SharedSyPtr *symbol)

{
  int iVar1;
  int iVar2;
  element_type *peVar3;
  pointer pcVar4;
  mapped_type *this_00;
  key_type local_68;
  size_type *local_48 [2];
  size_type local_38 [2];
  
  peVar3 = (symbol->super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  iVar1 = peVar3->_layerNum;
  pcVar4 = (peVar3->_name)._M_dataplus._M_p;
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_48,pcVar4,pcVar4 + (peVar3->_name)._M_string_length);
  find_least_layer_symbol((SymbolTable *)&local_68,(string *)this);
  iVar2 = *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_68._M_dataplus._M_p + 0x28)
                   )->_M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._M_string_length);
  }
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  if (iVar1 != iVar2) {
    std::
    vector<std::shared_ptr<front::symbol::Symbol>,_std::allocator<std::shared_ptr<front::symbol::Symbol>_>_>
    ::push_back(&this->symbol_stack,symbol);
    peVar3 = (symbol->super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    pcVar4 = (peVar3->_name)._M_dataplus._M_p;
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,pcVar4,pcVar4 + (peVar3->_name)._M_string_length);
    this_00 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<front::symbol::Symbol>,_std::allocator<std::shared_ptr<front::symbol::Symbol>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<front::symbol::Symbol>,_std::allocator<std::shared_ptr<front::symbol::Symbol>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<front::symbol::Symbol>,_std::allocator<std::shared_ptr<front::symbol::Symbol>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<front::symbol::Symbol>,_std::allocator<std::shared_ptr<front::symbol::Symbol>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&this->symbol_map,&local_68);
    std::
    vector<std::shared_ptr<front::symbol::Symbol>,_std::allocator<std::shared_ptr<front::symbol::Symbol>_>_>
    ::push_back(this_00,symbol);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,(ulong)(local_68.field_2._M_allocated_capacity + 1))
      ;
    }
  }
  return;
}

Assistant:

void SymbolTable::push_symbol(SharedSyPtr symbol) {
  if (symbol->getLayerNum() !=
      find_least_layer_symbol(symbol->getName())->getLayerNum()) {
    symbol_stack.push_back(symbol);
    symbol_map[symbol->getName()].push_back(symbol);
  }
}